

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::Parse(Cluster *this,longlong *pos,long *len)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  longlong lVar5;
  ulong uVar6;
  long lVar7;
  long unaff_RBP;
  longlong avail;
  longlong total;
  long local_68;
  long local_60;
  longlong local_58;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  long local_38;
  undefined4 extraout_var;
  
  lVar3 = Load(this,pos,len);
  if (lVar3 < 0) {
    return lVar3;
  }
  if (this->m_pos < this->m_element_start) {
    return -1;
  }
  if (this->m_timecode < 0) {
    return -1;
  }
  lVar3 = -1;
  if (-1 < this->m_element_size) {
    lVar3 = this->m_element_start + this->m_element_size;
  }
  if (lVar3 <= this->m_pos && -1 < lVar3) {
    return 1;
  }
  local_48 = this->m_pSegment->m_pReader;
  iVar2 = (*local_48->_vptr_IMkvReader[1])(local_48,&local_40,&local_60);
  if (iVar2 < 0) {
    return (long)iVar2;
  }
  if ((-1 < local_40) && (local_40 < local_60)) {
    return -2;
  }
  lVar7 = this->m_pos;
  *pos = lVar7;
  if (lVar3 < 0 || lVar7 < lVar3) {
    local_38 = 2;
    local_50 = 1;
    if (lVar7 < local_40 || local_40 < 0) {
      if (local_60 <= lVar7) {
        *len = 1;
        return -3;
      }
      lVar5 = GetUIntLength(local_48,lVar7,len);
      uVar6 = 1;
      if (lVar5 < 0) goto LAB_00124913;
      if (lVar5 == 0) {
        if ((-1 < lVar3) && (lVar3 < *len + *pos)) goto LAB_00124913;
        if (*len + *pos <= local_60) {
          lVar5 = ReadID(local_48,*pos,len);
          if (-1 < lVar5) {
            if ((lVar5 == 0x1f43b675) || (lVar5 == 0x1c53bb6b)) {
              uVar6 = 2;
              if (this->m_element_size < 0) {
                this->m_element_size = *pos - this->m_element_start;
                lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_38 * 4)))();
                return lVar3;
              }
              goto LAB_00124913;
            }
            lVar7 = *pos + *len;
            *pos = lVar7;
            if (local_60 <= lVar7) {
              *len = 1;
              lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_50 * 4)))();
              return lVar3;
            }
            local_58 = lVar5;
            lVar5 = GetUIntLength(local_48,lVar7,len);
            if (-1 < lVar5) {
              uVar6 = 1;
              if (lVar5 == 0) {
                if ((-1 < lVar3) && (lVar3 < *len + *pos)) goto LAB_00124913;
                if (*len + *pos <= local_60) {
                  uVar6 = ReadUInt(local_48,*pos,len);
                  if ((-1 < (long)uVar6) &&
                     ((-1L << ((char)*len * '\a' & 0x3fU) ^ uVar6) != 0xffffffffffffffff)) {
                    lVar7 = *len + *pos;
                    *pos = lVar7;
                    if (lVar3 < 0 || lVar7 <= lVar3) {
                      if (uVar6 == 0) {
                        uVar6 = 3;
                        goto LAB_00124913;
                      }
                      lVar7 = lVar7 + uVar6;
                      if (lVar3 < 0) {
                        if ((-1 < local_40) && (local_40 < lVar7)) {
                          this->m_element_size = local_40 - this->m_element_start;
                          *pos = local_40;
                          lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_38 * 4))
                                  )();
                          return lVar3;
                        }
                        if (local_60 < lVar7) {
                          *len = uVar6;
                          lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_50 * 4))
                                  )();
                          return lVar3;
                        }
                      }
                      else if (lVar3 < lVar7) {
                        if (local_58 != 0xa0) {
                          uVar6 = 1;
                          if (local_58 != 0xa3) {
                            *pos = lVar3;
                            lVar3 = (*(code *)(&DAT_00131548 +
                                              *(int *)(&DAT_00131548 + local_38 * 4)))();
                            return lVar3;
                          }
                          goto LAB_00124913;
                        }
                        goto LAB_00124b12;
                      }
                      if (local_58 == 0xa3) {
                        ParseSimpleBlock(this,uVar6,pos,len);
                        lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_50 * 4)))
                                          ();
                        return lVar3;
                      }
                      if (local_58 == 0xa0) {
                        ParseBlockGroup(this,uVar6,pos,len);
                        lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + local_50 * 4)))
                                          ();
                        return lVar3;
                      }
                      *pos = lVar7;
                      uVar6 = (ulong)(lVar3 < lVar7 && -1 < lVar3);
                      goto LAB_00124913;
                    }
                  }
                  goto LAB_00124b12;
                }
              }
              goto LAB_00124907;
            }
          }
LAB_00124b12:
          uVar6 = 1;
          goto LAB_00124913;
        }
      }
LAB_00124907:
      uVar6 = 1;
LAB_00124913:
      lVar3 = (*(code *)(&DAT_00131548 + *(int *)(&DAT_00131548 + uVar6 * 4)))();
      return lVar3;
    }
    unaff_RBP = local_68;
    if (this->m_element_size < 0) {
      this->m_element_size = lVar7 - this->m_element_start;
    }
  }
  if (this->m_element_size < 1) {
    return -2;
  }
  lVar7 = *pos;
  this->m_pos = lVar7;
  if (-1 < lVar3 && lVar3 < lVar7) {
    return -2;
  }
  if (this->m_entries_count < 1) {
    return 1;
  }
  if (this->m_entries[this->m_entries_count + -1] != (BlockEntry *)0x0) {
    iVar2 = (*this->m_entries[this->m_entries_count + -1]->_vptr_BlockEntry[2])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if ((plVar4 != (long *)0x0) && ((local_40 < 0 || (*plVar4 <= local_40)))) {
      lVar7 = *plVar4 + plVar4[1];
      if ((lVar3 < 0) || (lVar7 <= lVar3)) {
        bVar1 = lVar7 <= local_40 || local_40 < 0;
        if (lVar7 > local_40 && local_40 >= 0) {
          unaff_RBP = -1;
        }
      }
      else {
        bVar1 = false;
        unaff_RBP = -2;
      }
      goto LAB_0012488d;
    }
  }
  bVar1 = false;
  unaff_RBP = -1;
LAB_0012488d:
  if (bVar1) {
    return 1;
  }
  return unaff_RBP;
}

Assistant:

long Cluster::Parse(long long& pos, long& len) const {
  long status = Load(pos, len);

  if (status < 0)
    return status;

  if (m_pos < m_element_start || m_timecode < 0)
    return E_PARSE_FAILED;

  const long long cluster_stop =
      (m_element_size < 0) ? -1 : m_element_start + m_element_size;

  if ((cluster_stop >= 0) && (m_pos >= cluster_stop))
    return 1;  // nothing else to do

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    if ((total >= 0) && (pos >= total)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if ((id == libwebm::kMkvCluster) || (id == libwebm::kMkvCues)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    // const long long block_start = pos;
    const long long block_stop = pos + size;

    if (cluster_stop >= 0) {
      if (block_stop > cluster_stop) {
        if (id == libwebm::kMkvBlockGroup || id == libwebm::kMkvSimpleBlock) {
          return E_FILE_FORMAT_INVALID;
        }

        pos = cluster_stop;
        break;
      }
    } else if ((total >= 0) && (block_stop > total)) {
      m_element_size = total - m_element_start;
      pos = total;
      break;
    } else if (block_stop > avail) {
      len = static_cast<long>(size);
      return E_BUFFER_NOT_FULL;
    }

    Cluster* const this_ = const_cast<Cluster*>(this);

    if (id == libwebm::kMkvBlockGroup)
      return this_->ParseBlockGroup(size, pos, len);

    if (id == libwebm::kMkvSimpleBlock)
      return this_->ParseSimpleBlock(size, pos, len);

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (m_element_size < 1)
    return E_FILE_FORMAT_INVALID;

  m_pos = pos;
  if (cluster_stop >= 0 && m_pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_entries_count > 0) {
    const long idx = m_entries_count - 1;

    const BlockEntry* const pLast = m_entries[idx];
    if (pLast == NULL)
      return E_PARSE_FAILED;

    const Block* const pBlock = pLast->GetBlock();
    if (pBlock == NULL)
      return E_PARSE_FAILED;

    const long long start = pBlock->m_start;

    if ((total >= 0) && (start > total))
      return E_PARSE_FAILED;  // defend against trucated stream

    const long long size = pBlock->m_size;

    const long long stop = start + size;
    if (cluster_stop >= 0 && stop > cluster_stop)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && (stop > total))
      return E_PARSE_FAILED;  // defend against trucated stream
  }

  return 1;  // no more entries
}